

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

void fsg_model_write_fsm(fsg_model_t *fsg,FILE *fp)

{
  int local_1c;
  int i;
  FILE *fp_local;
  fsg_model_t *fsg_local;
  
  fsg_model_write_fsm_trans(fsg,fsg->start_state,fp);
  for (local_1c = 0; local_1c < fsg->n_state; local_1c = local_1c + 1) {
    if (local_1c != fsg->start_state) {
      fsg_model_write_fsm_trans(fsg,local_1c,fp);
    }
  }
  fprintf((FILE *)fp,"%d 0\n",(ulong)(uint)fsg->final_state);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
fsg_model_write_fsm(fsg_model_t * fsg, FILE * fp)
{
    int i;

    /* Write transitions from initial state first. */
    fsg_model_write_fsm_trans(fsg, fsg_model_start_state(fsg), fp);

    /* Other states. */
    for (i = 0; i < fsg->n_state; i++) {
        if (i == fsg_model_start_state(fsg))
            continue;
        fsg_model_write_fsm_trans(fsg, i, fp);
    }

    /* Final state. */
    fprintf(fp, "%d 0\n", fsg_model_final_state(fsg));

    fflush(fp);
}